

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall unitStrings_eV_Test::TestBody(unitStrings_eV_Test *this)

{
  precise_unit *ppVar1;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  char *pcVar2;
  double __x;
  double in_XMM1_Qa;
  precise_unit local_78;
  AssertionResult gtest_ar;
  string local_58;
  precise_unit local_38;
  precise_unit local_28;
  
  local_38.multiplier_ = 299792458.0;
  local_38.base_units_ = (unit_data)0xf1;
  local_38.commodity_ = 0;
  local_78 = units::precise_unit::operator/((precise_unit *)units::precise::energy::eV,&local_38);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_58;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_78,ppVar1,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&gtest_ar,"to_string(precise::energy::eV / constants::c.as_unit())",
             "\"eV/[c]\"",__return_storage_ptr__,(char (*) [7])"eV/[c]");
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    __return_storage_ptr__ = (string *)0x1da;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_28.multiplier_ = 299792458.0;
  local_28.base_units_ = (unit_data)0xf1;
  local_28.commodity_ = 0;
  local_38.multiplier_ = units::precise_unit::pow(&local_28,__x,in_XMM1_Qa);
  local_78 = units::precise_unit::operator/((precise_unit *)units::precise::energy::eV,&local_38);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)&local_78,ppVar1,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&gtest_ar,
             "to_string(precise::energy::eV / (constants::c.as_unit().pow(2)))","\"eV*[c]^-2\"",
             &local_58,(char (*) [10])"eV*[c]^-2");
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, eV)
{
    EXPECT_EQ(
        to_string(precise::energy::eV / constants::c.as_unit()), "eV/[c]");
    EXPECT_EQ(
        to_string(precise::energy::eV / (constants::c.as_unit().pow(2))),
        "eV*[c]^-2");
}